

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

uint32_t __thiscall
asmjit::CodeHolder::getLabelIdByName
          (CodeHolder *this,char *name,size_t nameLength,uint32_t parentId)

{
  int iVar1;
  uint32_t uVar2;
  ZoneHashNode *__s1;
  ZoneHashNode *pZVar3;
  ulong __n;
  uint uVar4;
  ulong local_30;
  
  local_30 = nameLength;
  anon_unknown_32::CodeHolder_hashNameAndFixLen(name,&local_30);
  uVar2 = 0;
  if (local_30 != 0) {
    pZVar3 = (ZoneHashNode *)(this->_namedLabels).super_ZoneHashBase._data;
    uVar4 = (uint)local_30;
    __n = local_30 & 0xffffffff;
    do {
      do {
        pZVar3 = *(ZoneHashNode **)pZVar3;
        if (pZVar3 == (ZoneHashNode *)0x0) {
          return 0;
        }
      } while (*(uint *)(pZVar3 + 0x30) != uVar4);
      if (uVar4 < 0xc) {
        __s1 = pZVar3 + 0x34;
      }
      else {
        __s1 = *(ZoneHashNode **)(pZVar3 + 0x38);
      }
      iVar1 = bcmp(__s1,name,__n);
    } while (iVar1 != 0);
    uVar2 = *(uint32_t *)(pZVar3 + 0xc);
  }
  return uVar2;
}

Assistant:

uint32_t CodeHolder::getLabelIdByName(const char* name, size_t nameLength, uint32_t parentId) noexcept {
  uint32_t hVal = CodeHolder_hashNameAndFixLen(name, nameLength);
  if (ASMJIT_UNLIKELY(!nameLength)) return 0;

  LabelEntry* le = _namedLabels.get(LabelByName(name, nameLength, hVal));
  return le ? le->getId() : static_cast<uint32_t>(0);
}